

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

Rune re2::ToLowerRune(Rune r)

{
  Rune RVar1;
  CaseFold *f;
  uint uVar2;
  
  uVar2 = r;
  if (r < 0x80) {
    uVar2 = r | 0x20;
    if (0x19 < r - 0x41U) {
      uVar2 = r;
    }
  }
  else {
    f = LookupCaseFold((CaseFold *)unicode_tolower,0xb4,r);
    if ((f != (CaseFold *)0x0) && (f->lo <= r)) {
      RVar1 = ApplyFold(f,r);
      return RVar1;
    }
  }
  return uVar2;
}

Assistant:

static Rune ToLowerRune(Rune r) {
  if (r < Runeself) {
    if ('A' <= r && r <= 'Z')
      r += 'a' - 'A';
    return r;
  }

  const CaseFold *f = LookupCaseFold(unicode_tolower, num_unicode_tolower, r);
  if (f == NULL || r < f->lo)
    return r;
  return ApplyFold(f, r);
}